

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O3

int CVodeGetLinSolveStats
              (void *cvode_mem,long *njevals,long *nfevalsLS,long *nliters,long *nlcfails,
              long *npevals,long *npsolves,long *njtsetups,long *njtimes)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVLsMem local_38;
  CVodeMem local_30;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeGetLinSolveStats",&local_30,&local_38);
  if (iVar1 == 0) {
    *njevals = local_38->nje;
    *nfevalsLS = local_38->nfeDQ;
    *nliters = local_38->nli;
    *nlcfails = local_38->ncfl;
    *npevals = local_38->npe;
    *npsolves = local_38->nps;
    *njtsetups = local_38->njtsetup;
    *njtimes = local_38->njtimes;
  }
  return iVar1;
}

Assistant:

int CVodeGetLinSolveStats(void* cvode_mem, long int* njevals, long int* nfevalsLS,
                          long int* nliters, long int* nlcfails,
                          long int* npevals, long int* npsolves,
                          long int* njtsetups, long int* njtimes)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure; set output value and return */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  *njevals   = cvls_mem->nje;
  *nfevalsLS = cvls_mem->nfeDQ;
  *nliters   = cvls_mem->nli;
  *nlcfails  = cvls_mem->ncfl;
  *npevals   = cvls_mem->npe;
  *npsolves  = cvls_mem->nps;
  *njtsetups = cvls_mem->njtsetup;
  *njtimes   = cvls_mem->njtimes;

  return (CVLS_SUCCESS);
}